

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_2dPoint __thiscall
ON_SubDFace::PackRectCorner(ON_SubDFace *this,bool bGridOrder,int corner_index)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ON_2dVector OVar5;
  double local_40;
  ON_2dVector delta;
  int local_28;
  int packrot_dex;
  int corner_index_local;
  bool bGridOrder_local;
  ON_SubDFace *this_local;
  ON_2dPoint corner;
  
  if ((this->m_pack_status_bits & 4) == 0) {
    corner.x = ON_2dPoint::NanPoint.y;
    this_local = (ON_SubDFace *)ON_2dPoint::NanPoint.x;
  }
  else {
    local_28 = (corner_index % 4 + 4) % 4;
    if (bGridOrder) {
      if (local_28 == 2) {
        local_28 = 3;
      }
      else if (local_28 == 3) {
        local_28 = 2;
      }
    }
    delta.y._4_4_ = 0;
    bVar1 = this->m_pack_status_bits & 3;
    if (bVar1 == 1) {
      delta.y._4_4_ = 3;
    }
    else if (bVar1 == 2) {
      delta.y._4_4_ = 2;
    }
    else if (bVar1 == 3) {
      delta.y._4_4_ = 1;
    }
    uVar2 = local_28 + delta.y._4_4_;
    uVar4 = uVar2;
    if ((int)uVar2 < 0) {
      uVar4 = local_28 + 3 + delta.y._4_4_;
    }
    iVar3 = uVar2 - (uVar4 & 0xfffffffc);
    _this_local = PackRectOrigin(this);
    OVar5 = PackRectSize(this);
    local_40 = OVar5.x;
    if (iVar3 == 1) {
      this_local = (ON_SubDFace *)(local_40 + (double)this_local);
    }
    else {
      delta.x = OVar5.y;
      if (iVar3 == 2) {
        corner.x = delta.x + corner.x;
        this_local = (ON_SubDFace *)(local_40 + (double)this_local);
      }
      else if (iVar3 == 3) {
        corner.x = delta.x + corner.x;
      }
    }
  }
  return _this_local;
}

Assistant:

const ON_2dPoint ON_SubDFace::PackRectCorner(bool bGridOrder, int corner_index) const
{
  if (0 == (m_pack_status_bits & ON_SubDFace::PackStatusBits::PackRectSet))
    return ON_2dPoint::NanPoint;

  corner_index = ((corner_index % 4) + 4) % 4;
  // now corner_index = 0,1,2 or 3.

  if (bGridOrder)
  {
    if (2 == corner_index)
      corner_index = 3;
    else if (3 == corner_index)
      corner_index = 2;
  }
  // now corner index is a counter-clockwise corner index

  int packrot_dex = 0;
  switch (m_pack_status_bits & ON_SubDFace::PackStatusBits::PackingRotateMask)
  {
  case ON_SubDFace::PackStatusBits::PackingRotate90:
    packrot_dex = 3;
    break;
  case ON_SubDFace::PackStatusBits::PackingRotate180:
    packrot_dex = 2;
    break;
  case ON_SubDFace::PackStatusBits::PackingRotate270:
    packrot_dex = 1;
    break;
  }

  corner_index = (corner_index + packrot_dex) % 4;
  // now the packing rotation is taken into account.

  ON_2dPoint corner = PackRectOrigin();
  const ON_2dVector delta = PackRectSize();
  switch (corner_index)
  {
  case 1:
    corner.x += delta.x;
    break;
  case 2:
    corner.x += delta.x;
    corner.y += delta.y;
    break;
  case 3:
    corner.y += delta.y;
    break;
  }

  return corner;
}